

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::SumOverTestCaseList
          (internal *this,
          vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *case_list,
          offset_in_TestCase_to_subr method)

{
  int iVar1;
  size_type sVar2;
  const_reference ppTVar3;
  long *plVar4;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *local_60;
  ulong local_40;
  size_t i;
  int sum;
  offset_in_TestCase_to_subr method_local;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *case_list_local;
  
  i._4_4_ = 0;
  for (local_40 = 0;
      sVar2 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)this),
      local_40 < sVar2; local_40 = local_40 + 1) {
    ppTVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)this,
                         local_40);
    plVar4 = (long *)((long)&(*ppTVar3)->_vptr_TestCase + method);
    local_60 = case_list;
    if (((ulong)case_list & 1) != 0) {
      local_60 = *(vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> **)
                  ((long)case_list + *plVar4 + -1);
    }
    iVar1 = (*(code *)local_60)(plVar4);
    i._4_4_ = iVar1 + i._4_4_;
  }
  return i._4_4_;
}

Assistant:

static int SumOverTestCaseList(const std::vector<TestCase*>& case_list,
                               int (TestCase::*method)() const) {
  int sum = 0;
  for (size_t i = 0; i < case_list.size(); i++) {
    sum += (case_list[i]->*method)();
  }
  return sum;
}